

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.cpp
# Opt level: O0

void __thiscall Centaurus::ATNNode<wchar_t>::parse_literal(ATNNode<wchar_t> *this,Stream *stream)

{
  wchar_t wVar1;
  StreamException *__return_storage_ptr__;
  wchar_t local_20;
  wchar_t ch;
  wchar_t leader;
  Stream *stream_local;
  ATNNode<wchar_t> *this_local;
  
  wVar1 = Stream::get(stream);
  local_20 = Stream::get(stream);
  while (local_20 != L'\0' && local_20 != wVar1) {
    wide_to_target<wchar_t>(local_20);
    std::__cxx11::wstring::push_back((int)this + L'p');
    local_20 = Stream::get(stream);
  }
  if (wVar1 != local_20) {
    __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
    Stream::unexpected(__return_storage_ptr__,stream,local_20);
    __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,StreamException::~StreamException)
    ;
  }
  return;
}

Assistant:

void ATNNode<TCHAR>::parse_literal(Stream& stream)
{
    wchar_t leader = stream.get();

    wchar_t ch = stream.get();

    for (; ch != L'\0' && ch != leader; ch = stream.get())
    {
        m_literal.push_back(wide_to_target<TCHAR>(ch));
    }

    if (leader != ch)
        throw stream.unexpected(ch);
}